

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char zBuf [16];
  DateTime x;
  char local_58;
  char local_57;
  undefined1 local_56;
  char local_55;
  char local_54;
  undefined1 local_53;
  char local_52;
  char local_51;
  undefined1 local_50;
  DateTime local_40;
  
  iVar1 = isDate(context,argc,argv,&local_40);
  if (iVar1 == 0) {
    computeHMS(&local_40);
    iVar1 = local_40.h / 10;
    local_58 = (char)iVar1 +
               ((char)(uint)((ulong)((long)iVar1 * 0x66666667) >> 0x22) - (char)(iVar1 >> 0x1f)) *
               -10 + '0';
    local_57 = (char)local_40.h + (char)iVar1 * -10 + '0';
    local_56 = 0x3a;
    iVar1 = local_40.m / 10;
    local_55 = (char)iVar1 +
               ((char)(uint)((ulong)((long)iVar1 * 0x66666667) >> 0x22) - (char)(iVar1 >> 0x1f)) *
               -10 + '0';
    local_54 = (char)local_40.m + (char)iVar1 * -10 + '0';
    local_53 = 0x3a;
    iVar1 = (int)local_40.s / 10;
    local_52 = (char)iVar1 +
               ((char)(uint)((ulong)((long)iVar1 * 0x66666667) >> 0x22) - (char)(iVar1 >> 0x1f)) *
               -10 + '0';
    local_51 = (char)(int)local_40.s + (char)iVar1 * -10 + '0';
    local_50 = 0;
    setResultStrOrError(context,&local_58,8,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int s;
    char zBuf[16];
    computeHMS(&x);
    zBuf[0] = '0' + (x.h/10)%10;
    zBuf[1] = '0' + (x.h)%10;
    zBuf[2] = ':';
    zBuf[3] = '0' + (x.m/10)%10;
    zBuf[4] = '0' + (x.m)%10;
    zBuf[5] = ':';
    s = (int)x.s;
    zBuf[6] = '0' + (s/10)%10;
    zBuf[7] = '0' + (s)%10;
    zBuf[8] = 0;
    sqlite3_result_text(context, zBuf, 8, SQLITE_TRANSIENT);
  }
}